

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<ClassInfoDef>::growAppend
          (QCommonArrayOps<ClassInfoDef> *this,ClassInfoDef *b,ClassInfoDef *e)

{
  ClassInfoDef *pCVar1;
  ClassInfoDef **data;
  QArrayDataPointer<ClassInfoDef> *old;
  long in_FS_OFFSET;
  QArrayDataPointer<ClassInfoDef> local_38;
  ClassInfoDef *local_20;
  long local_18;
  
  old = &local_38;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = b;
  if (b != e) {
    local_38.d = (Data *)0x0;
    local_38.ptr = (ClassInfoDef *)0x0;
    local_38.size = 0;
    pCVar1 = (this->super_Type).super_QGenericArrayOps<ClassInfoDef>.
             super_QArrayDataPointer<ClassInfoDef>.ptr;
    if ((b < pCVar1) ||
       (pCVar1 + (this->super_Type).super_QGenericArrayOps<ClassInfoDef>.
                 super_QArrayDataPointer<ClassInfoDef>.size <= b)) {
      data = (ClassInfoDef **)0x0;
      old = (QArrayDataPointer<ClassInfoDef> *)0x0;
    }
    else {
      data = &local_20;
    }
    QArrayDataPointer<ClassInfoDef>::detachAndGrow
              ((QArrayDataPointer<ClassInfoDef> *)this,GrowsAtEnd,
               ((long)e - (long)b >> 4) * -0x5555555555555555,data,old);
    QGenericArrayOps<ClassInfoDef>::copyAppend
              ((QGenericArrayOps<ClassInfoDef> *)this,local_20,
               (ClassInfoDef *)(((long)e - (long)b) + (long)local_20));
    QArrayDataPointer<ClassInfoDef>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }